

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.h
# Opt level: O0

void __thiscall
llbuild::buildsystem::ShellCommand::ShellCommand
          (ShellCommand *this,StringRef name,bool controlEnabled)

{
  bool controlEnabled_local;
  ShellCommand *this_local;
  StringRef name_local;
  
  ExternalCommand::Command(&this->super_ExternalCommand,name);
  (this->super_ExternalCommand).super_Command.super_JobDescriptor._vptr_JobDescriptor =
       (_func_int **)&PTR__ShellCommand_003e1968;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector(&this->args);
  std::__cxx11::string::string((string *)&this->signatureData);
  llvm::SmallVector<std::pair<llvm::StringRef,_llvm::StringRef>,_1U>::SmallVector(&this->env);
  llvm::
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1U>::
  SmallVector(&this->depsPaths);
  this->depsStyle = Unused;
  this->inheritEnv = true;
  this->canSafelyInterrupt = true;
  std::__cxx11::string::string((string *)&this->workingDirectory);
  this->controlEnabled = controlEnabled;
  memset(&this->cachedSignature,0,8);
  std::atomic<llbuild::basic::CommandSignature>::atomic(&this->cachedSignature);
  std::
  unique_ptr<llbuild::buildsystem::HandlerState,std::default_delete<llbuild::buildsystem::HandlerState>>
  ::unique_ptr<std::default_delete<llbuild::buildsystem::HandlerState>,void>
            ((unique_ptr<llbuild::buildsystem::HandlerState,std::default_delete<llbuild::buildsystem::HandlerState>>
              *)&this->handlerState);
  return;
}

Assistant:

ShellCommand(StringRef name, bool controlEnabled) : ExternalCommand(name),
    controlEnabled(controlEnabled) { }